

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>
          (ImPlot *this,GetterFuncPtr *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
          float line_weight,ImU32 col)

{
  float *pfVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  ImDrawList *this_00;
  ImU32 col_00;
  int iVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  double in_XMM1_Qa;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  GetterFuncPtr *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar4 = GImPlot;
  col_00 = (ImU32)DrawList;
  local_60 = (ImDrawList *)transformer;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    iVar2 = *(int *)(this + 0x10);
    local_48 = iVar2 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    local_58 = (undefined1  [8])this;
    local_50 = getter;
    local_44 = col_00;
    dVar6 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                      (long)(*(int *)(this + 0x14) % iVar2 + iVar2) % (long)iVar2 &
                                      0xffffffff);
    iVar2 = *(int *)&getter->Getter;
    local_3c.x = (float)((dVar6 - (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                        (double)GImPlot->PixelRange[iVar2].Min.x);
    local_3c.y = (float)((in_XMM1_Qa - GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) *
                         GImPlot->My[iVar2] + (double)GImPlot->PixelRange[iVar2].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>>
              ((StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLin> *)local_58,local_60
               ,&pIVar4->CurrentPlot->PlotRect);
  }
  else {
    iVar2 = *(int *)(this + 0x10);
    dVar6 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                      (long)(*(int *)(this + 0x14) % iVar2 + iVar2) % (long)iVar2 &
                                      0xffffffff);
    this_00 = local_60;
    iVar2 = *(int *)&getter->Getter;
    local_58._0_4_ =
         (undefined4)
         ((dVar6 - (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
         (double)GImPlot->PixelRange[iVar2].Min.x);
    dVar6 = (in_XMM1_Qa - GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) * GImPlot->My[iVar2] +
            (double)GImPlot->PixelRange[iVar2].Min.y;
    fVar8 = (float)dVar6;
    dVar6 = (double)CONCAT44((int)((ulong)dVar6 >> 0x20),fVar8);
    local_58._4_4_ = fVar8;
    iVar2 = *(int *)(this + 0x10);
    if (1 < iVar2) {
      iVar5 = 1;
      do {
        dVar7 = (double)(**(code **)this)(*(undefined8 *)(this + 8),
                                          (long)((*(int *)(this + 0x14) + iVar5) % iVar2 + iVar2) %
                                          (long)iVar2 & 0xffffffff);
        iVar2 = *(int *)&getter->Getter;
        local_70.x = (float)((dVar7 - (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[iVar2].Min.x);
        fVar9 = (float)((dVar6 - GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) * GImPlot->My[iVar2]
                       + (double)GImPlot->PixelRange[iVar2].Min.y);
        local_70.y = fVar9;
        pIVar3 = pIVar4->CurrentPlot;
        dVar6 = (double)(ulong)(uint)fVar9;
        fVar8 = (float)local_58._4_4_;
        if (fVar9 <= (float)local_58._4_4_) {
          fVar8 = fVar9;
        }
        if ((fVar8 < (pIVar3->PlotRect).Max.y) &&
           (fVar8 = (float)(~-(uint)(fVar9 <= (float)local_58._4_4_) & (uint)fVar9 |
                           -(uint)(fVar9 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar8 && fVar8 != *pfVar1)) {
          dVar6 = (double)(ulong)(uint)local_70.x;
          fVar8 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar8 = local_70.x;
          }
          if ((fVar8 < (pIVar3->PlotRect).Max.x) &&
             (fVar8 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar3->PlotRect).Min.x <= fVar8 && fVar8 != (pIVar3->PlotRect).Min.x)) {
            local_68.y = (float)local_58._4_4_;
            local_68.x = local_70.x;
            ImDrawList::AddLine(this_00,(ImVec2 *)local_58,&local_68,col_00,line_weight);
            ImDrawList::AddLine(this_00,&local_68,&local_70,col_00,line_weight);
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar5 = iVar5 + 1;
        iVar2 = *(int *)(this + 0x10);
      } while (iVar5 < iVar2);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}